

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O1

Bool prvTidySwitchInline(TidyDocImpl *doc,Node *element,Node *node)

{
  uint uVar1;
  Lexer *pLVar2;
  Dict *pDVar3;
  Dict *pDVar4;
  bool bVar5;
  IStack *pIVar6;
  tmbstr ptVar7;
  AttVal *pAVar8;
  IStack *pIVar9;
  AttVal *pAVar10;
  uint uVar11;
  uint uVar12;
  IStack *pIVar13;
  IStack *pIVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  IStack tmp_istack;
  
  pLVar2 = doc->lexer;
  if (((element != (Node *)0x0 && pLVar2 != (Lexer *)0x0) &&
      (pDVar3 = element->tag, node != (Node *)0x0 && pDVar3 != (Dict *)0x0)) &&
     (pDVar4 = node->tag, pDVar4 != (Dict *)0x0)) {
    uVar1 = pLVar2->istacksize;
    uVar15 = uVar1;
    do {
      uVar15 = uVar15 - 1;
      if ((int)uVar15 < 0) {
        return no;
      }
    } while (pLVar2->istack[uVar15 & 0x7fffffff].tag != pDVar3);
    uVar16 = uVar1;
    if (-1 < (int)uVar15) {
      do {
        uVar16 = uVar16 - 1;
        if ((int)uVar16 < 0) {
          return no;
        }
      } while (pLVar2->istack[uVar16 & 0x7fffffff].tag != pDVar4);
      if (((-1 < (int)uVar16) && (uVar11 = uVar1 - pLVar2->istackbase, 1 < uVar11)) &&
         (uVar17 = uVar11 - 1, -1 < (int)uVar17)) {
        pIVar13 = pLVar2->istack;
        do {
          uVar12 = uVar17;
          if (pIVar13[uVar17].tag == pDVar3) {
            uVar12 = uVar11 - 2;
            if (-1 < (int)uVar12) {
              do {
                if (pIVar13[uVar12].tag == pDVar4) {
                  pIVar14 = pIVar13 + uVar12;
                  goto LAB_0013f838;
                }
                bVar5 = 0 < (int)uVar12;
                uVar12 = uVar12 - 1;
              } while (bVar5);
              uVar12 = 0xffffffff;
            }
            pIVar14 = (IStack *)0x0;
LAB_0013f838:
            if (pIVar14 != (IStack *)0x0) {
              pIVar13 = pIVar13 + uVar17;
              pIVar6 = pIVar14->next;
              pDVar3 = pIVar14->tag;
              ptVar7 = pIVar14->element;
              pAVar8 = pIVar14->attributes;
              pIVar9 = pIVar13->next;
              pDVar4 = pIVar13->tag;
              pAVar10 = pIVar13->attributes;
              pIVar14->element = pIVar13->element;
              pIVar14->attributes = pAVar10;
              pIVar14->next = pIVar9;
              pIVar14->tag = pDVar4;
              pIVar13->element = ptVar7;
              pIVar13->attributes = pAVar8;
              pIVar13->next = pIVar6;
              pIVar13->tag = pDVar3;
              return yes;
            }
          }
          uVar11 = uVar12;
          uVar17 = uVar11 - 1;
        } while (-1 < (int)uVar17);
      }
    }
  }
  return no;
}

Assistant:

Bool TY_(SwitchInline)( TidyDocImpl* doc, Node* element, Node* node )
{
    Lexer* lexer = doc->lexer;
    if ( lexer
         && element && element->tag
         && node && node->tag
         && TY_(IsPushed)( doc, element )
         && TY_(IsPushed)( doc, node ) 
         && ((lexer->istacksize - lexer->istackbase) >= 2) )
    {
        /* we have a chance of succeeding ... */
        int i;
        for (i = (lexer->istacksize - lexer->istackbase - 1); i >= 0; --i)
        {
            if (lexer->istack[i].tag == element->tag) {
                /* found the element tag - phew */
                IStack *istack1 = &lexer->istack[i];
                IStack *istack2 = NULL;
                --i; /* back one more, and continue */
                for ( ; i >= 0; --i)
                {
                    if (lexer->istack[i].tag == node->tag)
                    {
                        /* found the element tag - phew */
                        istack2 = &lexer->istack[i];
                        break;
                    }
                }
                if ( istack2 )
                {
                    /* perform the swap */
                    IStack tmp_istack = *istack2;
                    *istack2 = *istack1;
                    *istack1 = tmp_istack;
                    return yes;
                }
            }
        }
    }
    return no;
}